

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O1

logic_t __thiscall slang::logic_t::operator!=(logic_t *this,logic_t *rhs)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  
  uVar3 = this->value;
  uVar1 = 0x80;
  uVar4 = uVar1;
  if ((uVar3 != '@' && uVar3 != 0x80) && (uVar2 = rhs->value, uVar2 != '@' && uVar2 != 0x80)) {
    uVar4 = uVar3 == uVar2;
  }
  uVar3 = uVar4 == '\0';
  if (uVar4 == '@') {
    uVar3 = uVar1;
  }
  if (uVar4 == 0x80) {
    uVar3 = uVar1;
  }
  return (logic_t)uVar3;
}

Assistant:

bool isUnknown() const { return value == x.value || value == z.value; }